

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

put_transaction<unsigned_short> * __thiscall
density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
start_emplace<unsigned_short,unsigned_short>
          (put_transaction<unsigned_short> *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *this,
          unsigned_short *i_construction_params)

{
  put_transaction<unsigned_short> local_70;
  put_transaction<unsigned_short> local_58;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  unsigned_short *i_construction_params_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  lock._8_8_ = i_construction_params;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,(mutex_type *)this);
  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<unsigned_short,unsigned_short>
            (&local_70,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             (this + 0x28),(unsigned_short *)lock._8_8_);
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::put_transaction
            (&local_58,0,(unique_lock<std::mutex> *)local_30,&local_70);
  put_transaction<unsigned_short>::put_transaction<unsigned_short,void>
            ((put_transaction<unsigned_short> *)__return_storage_ptr__,&local_58);
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::~put_transaction(&local_58);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::~put_transaction(&local_70);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            return put_transaction<ELEMENT_TYPE>(
              PrivateType(),
              std::move(lock),
              m_queue.template start_emplace<ELEMENT_TYPE>(
                std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...));
        }